

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::ColumnReader::CreateReader
          (ColumnReader *this,ParquetReader *reader,ParquetColumnSchema *schema)

{
  ParquetExtraTypeInfo PVar1;
  StringColumnReader *this_00;
  undefined *puVar2;
  NotImplementedException *pNVar3;
  InternalException *pIVar4;
  string local_48;
  
  switch((schema->type).id_) {
  case SQLNULL:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    puVar2 = &NullColumnReader::vtable;
    break;
  default:
    pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    LogicalType::ToString_abi_cxx11_(&local_48,&schema->type);
    NotImplementedException::NotImplementedException(pNVar3,&local_48);
    __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    this_00 = (StringColumnReader *)operator_new(0x208);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    this_00->fixed_width_string_length = 0;
    this_00[1].super_ColumnReader._vptr_ColumnReader = (_func_int **)0x0;
    (this_00->super_ColumnReader)._vptr_ColumnReader =
         (_func_int **)&PTR__TemplatedColumnReader_019aeeb0;
    *(undefined1 *)&this_00[1].super_ColumnReader.column_schema = 0;
    goto LAB_010c1ebc;
  case TINYINT:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<signed_char,duckdb::TemplatedParquetValueConversion<int>>::
              vtable;
    break;
  case SMALLINT:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<short,duckdb::TemplatedParquetValueConversion<int>>::vtable;
    break;
  case INTEGER:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<int,duckdb::TemplatedParquetValueConversion<int>>::vtable;
    break;
  case BIGINT:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<long,duckdb::TemplatedParquetValueConversion<long>>::vtable;
    break;
  case DATE:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    this_00->fixed_width_string_length = 0;
    this_00[1].super_ColumnReader._vptr_ColumnReader = (_func_int **)0x0;
    puVar2 = &CallbackColumnReader<int,duckdb::date_t,&duckdb::ParquetIntToDate>::vtable;
    goto LAB_010c1eb4;
  case TIME:
    PVar1 = schema->type_info;
    if (PVar1 == UNIT_NS) {
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_t,&duckdb::ParquetIntToTimeNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_48,reader,schema);
    }
    else if (PVar1 == UNIT_MICROS) {
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_t,&duckdb::ParquetIntToTime>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_48,reader,schema);
    }
    else {
      if (PVar1 != UNIT_MS) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"TIME requires type info","");
        InternalException::InternalException(pIVar4,&local_48);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      make_uniq<duckdb::CallbackColumnReader<int,duckdb::dtime_t,&duckdb::ParquetIntToTimeMs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_48,reader,schema);
    }
    goto LAB_010c1f65;
  case TIMESTAMP:
  case TIMESTAMP_TZ:
    switch(schema->type_info) {
    case IMPALA_TIMESTAMP:
      this_00 = (StringColumnReader *)operator_new(0x200);
      ColumnReader((ColumnReader *)this_00,reader,schema);
      this_00->fixed_width_string_length = 0;
      this_00[1].super_ColumnReader._vptr_ColumnReader = (_func_int **)0x0;
      puVar2 = &CallbackColumnReader<duckdb::Int96,duckdb::timestamp_t,&duckdb::ImpalaTimestampToTimestamp>
                ::vtable;
      break;
    case UNIT_NS:
      this_00 = (StringColumnReader *)operator_new(0x200);
      ColumnReader((ColumnReader *)this_00,reader,schema);
      this_00->fixed_width_string_length = 0;
      this_00[1].super_ColumnReader._vptr_ColumnReader = (_func_int **)0x0;
      puVar2 = &CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampNsToTimestamp>
                ::vtable;
      break;
    case UNIT_MS:
      this_00 = (StringColumnReader *)operator_new(0x200);
      ColumnReader((ColumnReader *)this_00,reader,schema);
      this_00->fixed_width_string_length = 0;
      this_00[1].super_ColumnReader._vptr_ColumnReader = (_func_int **)0x0;
      puVar2 = &CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampMsToTimestamp>
                ::vtable;
      break;
    case UNIT_MICROS:
      this_00 = (StringColumnReader *)operator_new(0x200);
      ColumnReader((ColumnReader *)this_00,reader,schema);
      this_00->fixed_width_string_length = 0;
      this_00[1].super_ColumnReader._vptr_ColumnReader = (_func_int **)0x0;
      puVar2 = &CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampMicrosToTimestamp>
                ::vtable;
      break;
    default:
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"TIMESTAMP requires type info","");
      InternalException::InternalException(pIVar4,&local_48);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_010c1eb4;
  case TIMESTAMP_NS:
    switch(schema->type_info) {
    case IMPALA_TIMESTAMP:
      make_uniq<duckdb::CallbackColumnReader<duckdb::Int96,duckdb::timestamp_ns_t,&duckdb::ImpalaTimestampToTimestampNS>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_48,reader,schema);
      break;
    case UNIT_NS:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampNsToTimestampNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_48,reader,schema);
      break;
    case UNIT_MS:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampMsToTimestampNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_48,reader,schema);
      break;
    case UNIT_MICROS:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampUsToTimestampNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_48,reader,schema);
      break;
    default:
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"TIMESTAMP_NS requires type info","");
      InternalException::InternalException(pIVar4,&local_48);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_010c1f65;
  case DECIMAL:
    PVar1 = schema->type_info;
    if (PVar1 != DECIMAL_BYTE_ARRAY) {
      if (PVar1 == DECIMAL_INT64) {
        CreateDecimalReader<long>((duckdb *)this,reader,schema);
        return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
               (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
      }
      if (PVar1 == DECIMAL_INT32) {
        CreateDecimalReader<int>((duckdb *)this,reader,schema);
        return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
               (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
      }
      pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unrecognized Parquet type for Decimal","");
      NotImplementedException::NotImplementedException(pNVar3,&local_48);
      __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
LAB_010c1de5:
    ParquetDecimalUtils::CreateReader((ParquetDecimalUtils *)this,reader,schema);
    return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
           (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
  case FLOAT:
    PVar1 = schema->type_info;
    this_00 = (StringColumnReader *)operator_new(0x200);
    if (PVar1 == FLOAT16) {
      ColumnReader((ColumnReader *)this_00,reader,schema);
      this_00->fixed_width_string_length = 0;
      this_00[1].super_ColumnReader._vptr_ColumnReader = (_func_int **)0x0;
      puVar2 = &CallbackColumnReader<unsigned_short,float,&duckdb::Float16ToFloat32>::vtable;
      goto LAB_010c1eb4;
    }
    ColumnReader((ColumnReader *)this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<float,duckdb::TemplatedParquetValueConversion<float>>::vtable;
    break;
  case DOUBLE:
    if (schema->type_info == DECIMAL_BYTE_ARRAY) goto LAB_010c1de5;
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<double,duckdb::TemplatedParquetValueConversion<double>>::vtable;
    break;
  case VARCHAR:
  case BLOB:
    this_00 = (StringColumnReader *)operator_new(0x1f8);
    StringColumnReader::StringColumnReader(this_00,reader,schema);
    goto LAB_010c1ebc;
  case INTERVAL:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    this_00->fixed_width_string_length = 0;
    this_00[1].super_ColumnReader._vptr_ColumnReader = (_func_int **)0x0;
    puVar2 = &IntervalColumnReader::vtable;
    goto LAB_010c1eb4;
  case UTINYINT:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<unsigned_char,duckdb::TemplatedParquetValueConversion<unsigned_int>>
              ::vtable;
    break;
  case USMALLINT:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<unsigned_short,duckdb::TemplatedParquetValueConversion<unsigned_int>>
              ::vtable;
    break;
  case UINTEGER:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<unsigned_int,duckdb::TemplatedParquetValueConversion<unsigned_int>>
              ::vtable;
    break;
  case UBIGINT:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<unsigned_long,duckdb::TemplatedParquetValueConversion<unsigned_long>>
              ::vtable;
    break;
  case TIME_TZ:
    PVar1 = schema->type_info;
    if (PVar1 == UNIT_NS) {
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeNsTZ>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_48,reader,schema);
    }
    else if (PVar1 == UNIT_MICROS) {
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeTZ>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_48,reader,schema);
    }
    else {
      if (PVar1 != UNIT_MS) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"TIME_TZ requires type info","");
        InternalException::InternalException(pIVar4,&local_48);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      make_uniq<duckdb::CallbackColumnReader<int,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeMsTZ>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_48,reader,schema);
    }
LAB_010c1f65:
    this->_vptr_ColumnReader = (_func_int **)local_48._M_dataplus._M_p;
    return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
           (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
  case UUID:
    this_00 = (StringColumnReader *)operator_new(0x200);
    ColumnReader((ColumnReader *)this_00,reader,schema);
    this_00->fixed_width_string_length = 0;
    this_00[1].super_ColumnReader._vptr_ColumnReader = (_func_int **)0x0;
    puVar2 = &UUIDColumnReader::vtable;
LAB_010c1eb4:
    (this_00->super_ColumnReader)._vptr_ColumnReader = (_func_int **)(puVar2 + 0x10);
    goto LAB_010c1ebc;
  }
  (this_00->super_ColumnReader)._vptr_ColumnReader = (_func_int **)(puVar2 + 0x10);
  this_00->fixed_width_string_length = 0;
  this_00[1].super_ColumnReader._vptr_ColumnReader = (_func_int **)0x0;
LAB_010c1ebc:
  this->_vptr_ColumnReader = (_func_int **)this_00;
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
}

Assistant:

unique_ptr<ColumnReader> ColumnReader::CreateReader(ParquetReader &reader, const ParquetColumnSchema &schema) {
	switch (schema.type.id()) {
	case LogicalTypeId::BOOLEAN:
		return make_uniq<BooleanColumnReader>(reader, schema);
	case LogicalTypeId::UTINYINT:
		return make_uniq<TemplatedColumnReader<uint8_t, TemplatedParquetValueConversion<uint32_t>>>(reader, schema);
	case LogicalTypeId::USMALLINT:
		return make_uniq<TemplatedColumnReader<uint16_t, TemplatedParquetValueConversion<uint32_t>>>(reader, schema);
	case LogicalTypeId::UINTEGER:
		return make_uniq<TemplatedColumnReader<uint32_t, TemplatedParquetValueConversion<uint32_t>>>(reader, schema);
	case LogicalTypeId::UBIGINT:
		return make_uniq<TemplatedColumnReader<uint64_t, TemplatedParquetValueConversion<uint64_t>>>(reader, schema);
	case LogicalTypeId::TINYINT:
		return make_uniq<TemplatedColumnReader<int8_t, TemplatedParquetValueConversion<int32_t>>>(reader, schema);
	case LogicalTypeId::SMALLINT:
		return make_uniq<TemplatedColumnReader<int16_t, TemplatedParquetValueConversion<int32_t>>>(reader, schema);
	case LogicalTypeId::INTEGER:
		return make_uniq<TemplatedColumnReader<int32_t, TemplatedParquetValueConversion<int32_t>>>(reader, schema);
	case LogicalTypeId::BIGINT:
		return make_uniq<TemplatedColumnReader<int64_t, TemplatedParquetValueConversion<int64_t>>>(reader, schema);
	case LogicalTypeId::FLOAT:
		if (schema.type_info == ParquetExtraTypeInfo::FLOAT16) {
			return make_uniq<CallbackColumnReader<uint16_t, float, Float16ToFloat32>>(reader, schema);
		}
		return make_uniq<TemplatedColumnReader<float, TemplatedParquetValueConversion<float>>>(reader, schema);
	case LogicalTypeId::DOUBLE:
		if (schema.type_info == ParquetExtraTypeInfo::DECIMAL_BYTE_ARRAY) {
			return ParquetDecimalUtils::CreateReader(reader, schema);
		}
		return make_uniq<TemplatedColumnReader<double, TemplatedParquetValueConversion<double>>>(reader, schema);
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::IMPALA_TIMESTAMP:
			return make_uniq<CallbackColumnReader<Int96, timestamp_t, ImpalaTimestampToTimestamp>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_t, ParquetTimestampMsToTimestamp>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_t, ParquetTimestampMicrosToTimestamp>>(reader,
			                                                                                                schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_t, ParquetTimestampNsToTimestamp>>(reader, schema);
		default:
			throw InternalException("TIMESTAMP requires type info");
		}
	case LogicalTypeId::TIMESTAMP_NS:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::IMPALA_TIMESTAMP:
			return make_uniq<CallbackColumnReader<Int96, timestamp_ns_t, ImpalaTimestampToTimestampNS>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_ns_t, ParquetTimestampMsToTimestampNs>>(reader,
			                                                                                                 schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_ns_t, ParquetTimestampUsToTimestampNs>>(reader,
			                                                                                                 schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_ns_t, ParquetTimestampNsToTimestampNs>>(reader,
			                                                                                                 schema);
		default:
			throw InternalException("TIMESTAMP_NS requires type info");
		}
	case LogicalTypeId::DATE:
		return make_uniq<CallbackColumnReader<int32_t, date_t, ParquetIntToDate>>(reader, schema);
	case LogicalTypeId::TIME:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int32_t, dtime_t, ParquetIntToTimeMs>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_t, ParquetIntToTime>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_t, ParquetIntToTimeNs>>(reader, schema);
		default:
			throw InternalException("TIME requires type info");
		}
	case LogicalTypeId::TIME_TZ:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int32_t, dtime_tz_t, ParquetIntToTimeMsTZ>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_tz_t, ParquetIntToTimeTZ>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_tz_t, ParquetIntToTimeNsTZ>>(reader, schema);
		default:
			throw InternalException("TIME_TZ requires type info");
		}
	case LogicalTypeId::BLOB:
	case LogicalTypeId::VARCHAR:
		return make_uniq<StringColumnReader>(reader, schema);
	case LogicalTypeId::DECIMAL:
		// we have to figure out what kind of int we need
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::DECIMAL_INT32:
			return CreateDecimalReader<int32_t>(reader, schema);
		case ParquetExtraTypeInfo::DECIMAL_INT64:
			return CreateDecimalReader<int64_t>(reader, schema);
		case ParquetExtraTypeInfo::DECIMAL_BYTE_ARRAY:
			return ParquetDecimalUtils::CreateReader(reader, schema);
		default:
			throw NotImplementedException("Unrecognized Parquet type for Decimal");
		}
		break;
	case LogicalTypeId::UUID:
		return make_uniq<UUIDColumnReader>(reader, schema);
	case LogicalTypeId::INTERVAL:
		return make_uniq<IntervalColumnReader>(reader, schema);
	case LogicalTypeId::SQLNULL:
		return make_uniq<NullColumnReader>(reader, schema);
	default:
		break;
	}
	throw NotImplementedException(schema.type.ToString());
}